

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_2x2_pack8_fp16.h
# Opt level: O1

void ncnn::conv2x2s1_weight_fp16_pack8_avx
               (Mat *kernel,Mat *kernel_tm_pack8,int num_input,int num_output)

{
  size_t sVar1;
  size_t sVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  unsigned_short uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  unsigned_short *puVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  void *pvVar20;
  long lVar21;
  void *pvVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  void *pvVar26;
  Mat weight_data_r2;
  void *local_2e0;
  void *local_2d8;
  ulong local_2d0;
  void *local_2c0;
  void *local_2b8;
  void *local_2b0;
  void *local_2a8;
  void *local_2a0;
  void *local_298;
  void *local_290;
  void *local_288;
  void *local_280;
  void *local_278;
  void *local_270;
  void *local_268;
  void *local_260;
  void *local_258;
  void *local_250;
  void *local_248;
  void *local_240;
  void *local_238;
  void *local_230;
  void *local_228;
  void *local_220;
  void *local_218;
  void *local_210;
  void *local_208;
  void *local_200;
  void *local_1f8;
  void *local_1f0;
  void *local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  void *local_1c8;
  void *local_1c0;
  void *local_1b8;
  void *local_1b0;
  void *local_1a8;
  void *local_1a0;
  void *local_198;
  void *local_190;
  void *local_188;
  void *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  void *local_160;
  void *local_158;
  void *local_150;
  void *local_148;
  void *local_140;
  void *local_138;
  void *local_130;
  void *local_128;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  void *local_c8;
  void *local_c0;
  void *local_b8;
  void *local_b0;
  void *local_a8;
  void *local_a0;
  Mat local_78;
  
  Mat::reshape(&local_78,kernel,4,num_input,num_output,(Allocator *)0x0);
  iVar12 = num_input + 7;
  if (-1 < num_input) {
    iVar12 = num_input;
  }
  iVar7 = num_output + 7;
  if (-1 < num_output) {
    iVar7 = num_output;
  }
  Mat::create(kernel_tm_pack8,4,iVar12 >> 3,iVar7 >> 3,0x80,0x40,(Allocator *)0x0);
  if (7 < num_output) {
    local_e0 = 7;
    local_e8 = 6;
    local_f0 = 5;
    local_f8 = 4;
    local_100 = 3;
    local_108 = 2;
    local_110 = 1;
    local_2d0 = 0;
    do {
      if (7 < num_input) {
        sVar1 = kernel_tm_pack8->cstep;
        sVar2 = kernel_tm_pack8->elemsize;
        lVar25 = (long)local_78.w;
        lVar24 = (long)local_78.w;
        iVar12 = kernel_tm_pack8->w;
        lVar17 = local_78.cstep * local_e0;
        lVar8 = local_78.cstep * local_e8;
        lVar19 = local_78.cstep * local_f0;
        lVar23 = lVar25 * 7;
        lVar9 = local_78.cstep * local_f8;
        lVar14 = local_78.cstep * local_100;
        lVar10 = local_78.cstep * local_108;
        lVar11 = local_78.cstep * local_110;
        lVar21 = local_78.cstep * local_2d0;
        lVar4 = lVar25 * 3;
        lVar5 = lVar25 * 5;
        pvVar3 = kernel_tm_pack8->data;
        local_2c0 = (void *)((lVar17 + lVar24 * 7) * local_78.elemsize + (long)local_78.data);
        local_2b8 = (void *)((lVar24 * 7 + lVar8) * local_78.elemsize + (long)local_78.data);
        local_2b0 = (void *)((lVar19 + lVar23) * local_78.elemsize + (long)local_78.data);
        local_2a8 = (void *)((lVar9 + lVar23) * local_78.elemsize + (long)local_78.data);
        local_2a0 = (void *)((lVar14 + lVar23) * local_78.elemsize + (long)local_78.data);
        local_298 = (void *)((lVar10 + lVar23) * local_78.elemsize + (long)local_78.data);
        local_290 = (void *)((lVar11 + lVar23) * local_78.elemsize + (long)local_78.data);
        local_288 = (void *)((lVar23 + lVar21) * local_78.elemsize + (long)local_78.data);
        local_280 = (void *)((lVar17 + lVar24 * 6) * local_78.elemsize + (long)local_78.data);
        local_278 = (void *)((lVar24 * 6 + lVar8) * local_78.elemsize + (long)local_78.data);
        local_270 = (void *)((lVar19 + lVar25 * 6) * local_78.elemsize + (long)local_78.data);
        local_268 = (void *)((lVar9 + lVar25 * 6) * local_78.elemsize + (long)local_78.data);
        local_260 = (void *)((lVar14 + lVar25 * 6) * local_78.elemsize + (long)local_78.data);
        local_258 = (void *)((lVar25 * 6 + lVar10) * local_78.elemsize + (long)local_78.data);
        local_250 = (void *)((lVar25 * 6 + lVar11) * local_78.elemsize + (long)local_78.data);
        local_248 = (void *)((lVar21 + lVar25 * 6) * local_78.elemsize + (long)local_78.data);
        local_240 = (void *)((lVar17 + lVar24 * 5) * local_78.elemsize + (long)local_78.data);
        local_238 = (void *)((lVar24 * 5 + lVar8) * local_78.elemsize + (long)local_78.data);
        local_230 = (void *)((lVar19 + lVar5) * local_78.elemsize + (long)local_78.data);
        local_228 = (void *)((lVar9 + lVar5) * local_78.elemsize + (long)local_78.data);
        local_220 = (void *)((lVar14 + lVar5) * local_78.elemsize + (long)local_78.data);
        local_218 = (void *)((lVar5 + lVar10) * local_78.elemsize + (long)local_78.data);
        local_210 = (void *)((lVar5 + lVar11) * local_78.elemsize + (long)local_78.data);
        local_208 = (void *)((lVar5 + lVar21) * local_78.elemsize + (long)local_78.data);
        local_200 = (void *)((lVar17 + lVar24 * 4) * local_78.elemsize + (long)local_78.data);
        local_1f8 = (void *)((lVar8 + lVar24 * 4) * local_78.elemsize + (long)local_78.data);
        local_1f0 = (void *)((lVar19 + lVar25 * 4) * local_78.elemsize + (long)local_78.data);
        local_1e8 = (void *)((lVar9 + lVar25 * 4) * local_78.elemsize + (long)local_78.data);
        local_1e0 = (void *)((lVar14 + lVar25 * 4) * local_78.elemsize + (long)local_78.data);
        local_1d8 = (void *)((lVar25 * 4 + lVar10) * local_78.elemsize + (long)local_78.data);
        local_1d0 = (void *)((lVar25 * 4 + lVar11) * local_78.elemsize + (long)local_78.data);
        local_1c8 = (void *)((lVar21 + lVar25 * 4) * local_78.elemsize + (long)local_78.data);
        local_1c0 = (void *)((lVar17 + lVar24 * 3) * local_78.elemsize + (long)local_78.data);
        local_1b8 = (void *)((lVar24 * 3 + lVar8) * local_78.elemsize + (long)local_78.data);
        local_1b0 = (void *)((lVar19 + lVar4) * local_78.elemsize + (long)local_78.data);
        local_1a8 = (void *)((lVar9 + lVar4) * local_78.elemsize + (long)local_78.data);
        local_1a0 = (void *)((lVar14 + lVar4) * local_78.elemsize + (long)local_78.data);
        local_198 = (void *)((lVar4 + lVar10) * local_78.elemsize + (long)local_78.data);
        local_190 = (void *)((lVar11 + lVar4) * local_78.elemsize + (long)local_78.data);
        local_c8 = (void *)((lVar4 + lVar21) * local_78.elemsize + (long)local_78.data);
        local_188 = (void *)((lVar17 + lVar24 * 2) * local_78.elemsize + (long)local_78.data);
        local_180 = (void *)((lVar8 + lVar24 * 2) * local_78.elemsize + (long)local_78.data);
        local_178 = (void *)((lVar19 + lVar25 * 2) * local_78.elemsize + (long)local_78.data);
        local_170 = (void *)((lVar9 + lVar25 * 2) * local_78.elemsize + (long)local_78.data);
        local_168 = (void *)((lVar14 + lVar25 * 2) * local_78.elemsize + (long)local_78.data);
        local_160 = (void *)((lVar25 * 2 + lVar10) * local_78.elemsize + (long)local_78.data);
        local_158 = (void *)((lVar11 + lVar25 * 2) * local_78.elemsize + (long)local_78.data);
        local_150 = (void *)((lVar21 + lVar25 * 2) * local_78.elemsize + (long)local_78.data);
        local_148 = (void *)((lVar17 + lVar24) * local_78.elemsize + (long)local_78.data);
        local_140 = (void *)((lVar24 + lVar8) * local_78.elemsize + (long)local_78.data);
        local_c0 = (void *)((lVar19 + lVar25) * local_78.elemsize + (long)local_78.data);
        local_b8 = (void *)((lVar9 + lVar25) * local_78.elemsize + (long)local_78.data);
        local_b0 = (void *)((lVar14 + lVar25) * local_78.elemsize + (long)local_78.data);
        local_a8 = (void *)((lVar10 + lVar25) * local_78.elemsize + (long)local_78.data);
        local_a0 = (void *)((lVar11 + lVar25) * local_78.elemsize + (long)local_78.data);
        local_2e0 = (void *)((lVar25 + lVar21) * local_78.elemsize + (long)local_78.data);
        local_138 = (void *)(lVar17 * local_78.elemsize + (long)local_78.data);
        local_130 = (void *)(lVar8 * local_78.elemsize + (long)local_78.data);
        local_128 = (void *)(lVar19 * local_78.elemsize + (long)local_78.data);
        local_2d8 = (void *)(lVar9 * local_78.elemsize + (long)local_78.data);
        pvVar26 = (void *)(lVar14 * local_78.elemsize + (long)local_78.data);
        pvVar20 = (void *)(lVar10 * local_78.elemsize + (long)local_78.data);
        pvVar13 = (void *)(lVar11 * local_78.elemsize + (long)local_78.data);
        pvVar22 = (void *)(lVar21 * local_78.elemsize + (long)local_78.data);
        lVar4 = local_78.elemsize * lVar24 * 8;
        lVar5 = local_78.elemsize * lVar25 * 8;
        uVar15 = 0;
        do {
          puVar16 = (unsigned_short *)
                    ((long)pvVar3 +
                    (uVar15 >> 3) * (long)iVar12 * sVar2 + (local_2d0 >> 3) * sVar1 * sVar2);
          lVar23 = 0;
          do {
            uVar6 = float32_to_float16(*(float *)((long)pvVar22 + lVar23));
            *puVar16 = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)pvVar13 + lVar23));
            puVar16[1] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)pvVar20 + lVar23));
            puVar16[2] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)pvVar26 + lVar23));
            puVar16[3] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_2d8 + lVar23));
            puVar16[4] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_128 + lVar23));
            puVar16[5] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_130 + lVar23));
            puVar16[6] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_138 + lVar23));
            puVar16[7] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_2e0 + lVar23));
            puVar16[8] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_a0 + lVar23));
            puVar16[9] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_a8 + lVar23));
            puVar16[10] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_b0 + lVar23));
            puVar16[0xb] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_b8 + lVar23));
            puVar16[0xc] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_c0 + lVar23));
            puVar16[0xd] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_140 + lVar23));
            puVar16[0xe] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_148 + lVar23));
            puVar16[0xf] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_150 + lVar23));
            puVar16[0x10] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_158 + lVar23));
            puVar16[0x11] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_160 + lVar23));
            puVar16[0x12] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_168 + lVar23));
            puVar16[0x13] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_170 + lVar23));
            puVar16[0x14] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_178 + lVar23));
            puVar16[0x15] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_180 + lVar23));
            puVar16[0x16] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_188 + lVar23));
            puVar16[0x17] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_c8 + lVar23));
            puVar16[0x18] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_190 + lVar23));
            puVar16[0x19] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_198 + lVar23));
            puVar16[0x1a] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1a0 + lVar23));
            puVar16[0x1b] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1a8 + lVar23));
            puVar16[0x1c] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1b0 + lVar23));
            puVar16[0x1d] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1b8 + lVar23));
            puVar16[0x1e] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1c0 + lVar23));
            puVar16[0x1f] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1c8 + lVar23));
            puVar16[0x20] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1d0 + lVar23));
            puVar16[0x21] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1d8 + lVar23));
            puVar16[0x22] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1e0 + lVar23));
            puVar16[0x23] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1e8 + lVar23));
            puVar16[0x24] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1f0 + lVar23));
            puVar16[0x25] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_1f8 + lVar23));
            puVar16[0x26] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_200 + lVar23));
            puVar16[0x27] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_208 + lVar23));
            puVar16[0x28] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_210 + lVar23));
            puVar16[0x29] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_218 + lVar23));
            puVar16[0x2a] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_220 + lVar23));
            puVar16[0x2b] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_228 + lVar23));
            puVar16[0x2c] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_230 + lVar23));
            puVar16[0x2d] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_238 + lVar23));
            puVar16[0x2e] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_240 + lVar23));
            puVar16[0x2f] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_248 + lVar23));
            puVar16[0x30] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_250 + lVar23));
            puVar16[0x31] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_258 + lVar23));
            puVar16[0x32] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_260 + lVar23));
            puVar16[0x33] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_268 + lVar23));
            puVar16[0x34] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_270 + lVar23));
            puVar16[0x35] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_278 + lVar23));
            puVar16[0x36] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_280 + lVar23));
            puVar16[0x37] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_288 + lVar23));
            puVar16[0x38] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_290 + lVar23));
            puVar16[0x39] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_298 + lVar23));
            puVar16[0x3a] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_2a0 + lVar23));
            puVar16[0x3b] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_2a8 + lVar23));
            puVar16[0x3c] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_2b0 + lVar23));
            puVar16[0x3d] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_2b8 + lVar23));
            puVar16[0x3e] = uVar6;
            uVar6 = float32_to_float16(*(float *)((long)local_2c0 + lVar23));
            puVar16[0x3f] = uVar6;
            puVar16 = puVar16 + 0x40;
            lVar23 = lVar23 + 4;
          } while (lVar23 != 0x10);
          uVar18 = uVar15 + 0xf;
          local_2c0 = (void *)((long)local_2c0 + lVar4);
          local_2b8 = (void *)((long)local_2b8 + lVar4);
          local_2b0 = (void *)((long)local_2b0 + lVar5);
          local_2a8 = (void *)((long)local_2a8 + lVar5);
          local_2a0 = (void *)((long)local_2a0 + lVar5);
          local_298 = (void *)((long)local_298 + lVar5);
          local_290 = (void *)((long)local_290 + lVar5);
          local_288 = (void *)((long)local_288 + lVar5);
          local_280 = (void *)((long)local_280 + lVar4);
          local_278 = (void *)((long)local_278 + lVar4);
          local_270 = (void *)((long)local_270 + lVar5);
          local_268 = (void *)((long)local_268 + lVar5);
          local_260 = (void *)((long)local_260 + lVar5);
          local_258 = (void *)((long)local_258 + lVar5);
          local_250 = (void *)((long)local_250 + lVar5);
          local_248 = (void *)((long)local_248 + lVar5);
          local_240 = (void *)((long)local_240 + lVar4);
          local_238 = (void *)((long)local_238 + lVar4);
          local_230 = (void *)((long)local_230 + lVar5);
          local_228 = (void *)((long)local_228 + lVar5);
          local_220 = (void *)((long)local_220 + lVar5);
          local_218 = (void *)((long)local_218 + lVar5);
          local_210 = (void *)((long)local_210 + lVar5);
          local_208 = (void *)((long)local_208 + lVar5);
          local_200 = (void *)((long)local_200 + lVar4);
          local_1f8 = (void *)((long)local_1f8 + lVar4);
          local_1f0 = (void *)((long)local_1f0 + lVar5);
          local_1e8 = (void *)((long)local_1e8 + lVar5);
          local_1e0 = (void *)((long)local_1e0 + lVar5);
          local_1d8 = (void *)((long)local_1d8 + lVar5);
          local_1d0 = (void *)((long)local_1d0 + lVar5);
          local_1c8 = (void *)((long)local_1c8 + lVar5);
          local_1c0 = (void *)((long)local_1c0 + lVar4);
          local_1b8 = (void *)((long)local_1b8 + lVar4);
          local_1b0 = (void *)((long)local_1b0 + lVar5);
          local_1a8 = (void *)((long)local_1a8 + lVar5);
          local_1a0 = (void *)((long)local_1a0 + lVar5);
          local_198 = (void *)((long)local_198 + lVar5);
          local_190 = (void *)((long)local_190 + lVar5);
          local_c8 = (void *)((long)local_c8 + lVar5);
          local_188 = (void *)((long)local_188 + lVar4);
          local_180 = (void *)((long)local_180 + lVar4);
          local_178 = (void *)((long)local_178 + lVar5);
          local_170 = (void *)((long)local_170 + lVar5);
          local_168 = (void *)((long)local_168 + lVar5);
          local_160 = (void *)((long)local_160 + lVar5);
          local_158 = (void *)((long)local_158 + lVar5);
          local_150 = (void *)((long)local_150 + lVar5);
          local_148 = (void *)((long)local_148 + lVar4);
          local_140 = (void *)((long)local_140 + lVar4);
          local_c0 = (void *)((long)local_c0 + lVar5);
          local_b8 = (void *)((long)local_b8 + lVar5);
          local_b0 = (void *)((long)local_b0 + lVar5);
          local_a8 = (void *)((long)local_a8 + lVar5);
          local_a0 = (void *)((long)local_a0 + lVar5);
          local_2e0 = (void *)((long)local_2e0 + lVar5);
          local_138 = (void *)((long)local_138 + lVar4);
          local_130 = (void *)((long)local_130 + lVar4);
          local_128 = (void *)((long)local_128 + lVar5);
          local_2d8 = (void *)((long)local_2d8 + lVar5);
          pvVar26 = (void *)((long)pvVar26 + lVar5);
          pvVar20 = (void *)((long)pvVar20 + lVar5);
          pvVar13 = (void *)((long)pvVar13 + lVar5);
          pvVar22 = (void *)((long)pvVar22 + lVar5);
          uVar15 = uVar15 + 8;
        } while (uVar18 < (uint)num_input);
      }
      local_2d0 = local_2d0 + 8;
      local_e0 = local_e0 + 8;
      local_e8 = local_e8 + 8;
      local_f0 = local_f0 + 8;
      local_f8 = local_f8 + 8;
      local_100 = local_100 + 8;
      local_108 = local_108 + 8;
      local_110 = local_110 + 8;
    } while ((int)((uint)local_2d0 | 7) < num_output);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv2x2s1_weight_fp16_pack8_avx(const Mat& kernel, Mat& kernel_tm_pack8, int num_input, int num_output)
{
    // src = kw-kh-inch-outch
    // dst = 8b-8a-kw-kh-inch/8a-outch/8b
    Mat weight_data_r2 = kernel.reshape(4, num_input, num_output);

    kernel_tm_pack8.create(4, num_input / 8, num_output / 8, (size_t)2 * 64, 64);

    for (int q = 0; q + 7 < num_output; q += 8)
    {
        const Mat k0 = weight_data_r2.channel(q);
        const Mat k1 = weight_data_r2.channel(q + 1);
        const Mat k2 = weight_data_r2.channel(q + 2);
        const Mat k3 = weight_data_r2.channel(q + 3);
        const Mat k4 = weight_data_r2.channel(q + 4);
        const Mat k5 = weight_data_r2.channel(q + 5);
        const Mat k6 = weight_data_r2.channel(q + 6);
        const Mat k7 = weight_data_r2.channel(q + 7);

        Mat g0 = kernel_tm_pack8.channel(q / 8);

        for (int p = 0; p + 7 < num_input; p += 8)
        {
            const float* k00 = k0.row(p);
            const float* k01 = k0.row(p + 1);
            const float* k02 = k0.row(p + 2);
            const float* k03 = k0.row(p + 3);
            const float* k04 = k0.row(p + 4);
            const float* k05 = k0.row(p + 5);
            const float* k06 = k0.row(p + 6);
            const float* k07 = k0.row(p + 7);

            const float* k10 = k1.row(p);
            const float* k11 = k1.row(p + 1);
            const float* k12 = k1.row(p + 2);
            const float* k13 = k1.row(p + 3);
            const float* k14 = k1.row(p + 4);
            const float* k15 = k1.row(p + 5);
            const float* k16 = k1.row(p + 6);
            const float* k17 = k1.row(p + 7);

            const float* k20 = k2.row(p);
            const float* k21 = k2.row(p + 1);
            const float* k22 = k2.row(p + 2);
            const float* k23 = k2.row(p + 3);
            const float* k24 = k2.row(p + 4);
            const float* k25 = k2.row(p + 5);
            const float* k26 = k2.row(p + 6);
            const float* k27 = k2.row(p + 7);

            const float* k30 = k3.row(p);
            const float* k31 = k3.row(p + 1);
            const float* k32 = k3.row(p + 2);
            const float* k33 = k3.row(p + 3);
            const float* k34 = k3.row(p + 4);
            const float* k35 = k3.row(p + 5);
            const float* k36 = k3.row(p + 6);
            const float* k37 = k3.row(p + 7);

            const float* k40 = k4.row(p);
            const float* k41 = k4.row(p + 1);
            const float* k42 = k4.row(p + 2);
            const float* k43 = k4.row(p + 3);
            const float* k44 = k4.row(p + 4);
            const float* k45 = k4.row(p + 5);
            const float* k46 = k4.row(p + 6);
            const float* k47 = k4.row(p + 7);

            const float* k50 = k5.row(p);
            const float* k51 = k5.row(p + 1);
            const float* k52 = k5.row(p + 2);
            const float* k53 = k5.row(p + 3);
            const float* k54 = k5.row(p + 4);
            const float* k55 = k5.row(p + 5);
            const float* k56 = k5.row(p + 6);
            const float* k57 = k5.row(p + 7);

            const float* k60 = k6.row(p);
            const float* k61 = k6.row(p + 1);
            const float* k62 = k6.row(p + 2);
            const float* k63 = k6.row(p + 3);
            const float* k64 = k6.row(p + 4);
            const float* k65 = k6.row(p + 5);
            const float* k66 = k6.row(p + 6);
            const float* k67 = k6.row(p + 7);

            const float* k70 = k7.row(p);
            const float* k71 = k7.row(p + 1);
            const float* k72 = k7.row(p + 2);
            const float* k73 = k7.row(p + 3);
            const float* k74 = k7.row(p + 4);
            const float* k75 = k7.row(p + 5);
            const float* k76 = k7.row(p + 6);
            const float* k77 = k7.row(p + 7);

            unsigned short* g00 = (unsigned short*)g0.row(p / 8);

            for (int k = 0; k < 4; k++)
            {
                g00[0] = float32_to_float16(k00[k]);
                g00[1] = float32_to_float16(k10[k]);
                g00[2] = float32_to_float16(k20[k]);
                g00[3] = float32_to_float16(k30[k]);
                g00[4] = float32_to_float16(k40[k]);
                g00[5] = float32_to_float16(k50[k]);
                g00[6] = float32_to_float16(k60[k]);
                g00[7] = float32_to_float16(k70[k]);
                g00 += 8;
                g00[0] = float32_to_float16(k01[k]);
                g00[1] = float32_to_float16(k11[k]);
                g00[2] = float32_to_float16(k21[k]);
                g00[3] = float32_to_float16(k31[k]);
                g00[4] = float32_to_float16(k41[k]);
                g00[5] = float32_to_float16(k51[k]);
                g00[6] = float32_to_float16(k61[k]);
                g00[7] = float32_to_float16(k71[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k02[k]);
                g00[1] = float32_to_float16(k12[k]);
                g00[2] = float32_to_float16(k22[k]);
                g00[3] = float32_to_float16(k32[k]);
                g00[4] = float32_to_float16(k42[k]);
                g00[5] = float32_to_float16(k52[k]);
                g00[6] = float32_to_float16(k62[k]);
                g00[7] = float32_to_float16(k72[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k03[k]);
                g00[1] = float32_to_float16(k13[k]);
                g00[2] = float32_to_float16(k23[k]);
                g00[3] = float32_to_float16(k33[k]);
                g00[4] = float32_to_float16(k43[k]);
                g00[5] = float32_to_float16(k53[k]);
                g00[6] = float32_to_float16(k63[k]);
                g00[7] = float32_to_float16(k73[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k04[k]);
                g00[1] = float32_to_float16(k14[k]);
                g00[2] = float32_to_float16(k24[k]);
                g00[3] = float32_to_float16(k34[k]);
                g00[4] = float32_to_float16(k44[k]);
                g00[5] = float32_to_float16(k54[k]);
                g00[6] = float32_to_float16(k64[k]);
                g00[7] = float32_to_float16(k74[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k05[k]);
                g00[1] = float32_to_float16(k15[k]);
                g00[2] = float32_to_float16(k25[k]);
                g00[3] = float32_to_float16(k35[k]);
                g00[4] = float32_to_float16(k45[k]);
                g00[5] = float32_to_float16(k55[k]);
                g00[6] = float32_to_float16(k65[k]);
                g00[7] = float32_to_float16(k75[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k06[k]);
                g00[1] = float32_to_float16(k16[k]);
                g00[2] = float32_to_float16(k26[k]);
                g00[3] = float32_to_float16(k36[k]);
                g00[4] = float32_to_float16(k46[k]);
                g00[5] = float32_to_float16(k56[k]);
                g00[6] = float32_to_float16(k66[k]);
                g00[7] = float32_to_float16(k76[k]);

                g00 += 8;
                g00[0] = float32_to_float16(k07[k]);
                g00[1] = float32_to_float16(k17[k]);
                g00[2] = float32_to_float16(k27[k]);
                g00[3] = float32_to_float16(k37[k]);
                g00[4] = float32_to_float16(k47[k]);
                g00[5] = float32_to_float16(k57[k]);
                g00[6] = float32_to_float16(k67[k]);
                g00[7] = float32_to_float16(k77[k]);

                g00 += 8;
            }
        }
    }
}